

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::runSingleRead
          (InterCallTestCase *this,int targetHandle,int stepNdx,int *programFriendlyName,
          int *resultStorageFriendlyName)

{
  ostringstream *this_00;
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  mapped_type_conflict *pmVar6;
  undefined4 uVar7;
  char *pcVar8;
  long lVar9;
  int targetHandle_local;
  int local_1b4;
  MessageBuilder local_1b0;
  long lVar4;
  
  targetHandle_local = targetHandle;
  local_1b4 = stepNdx;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  std::operator<<((ostream *)&local_1b0.m_str,"Running program #");
  *programFriendlyName = *programFriendlyName + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,programFriendlyName);
  this_00 = &pMVar5->m_str;
  std::operator<<((ostream *)this_00," to verify ");
  pcVar8 = "image";
  if (this->m_storage == STORAGE_BUFFER) {
    pcVar8 = "buffer";
  }
  std::operator<<((ostream *)this_00,pcVar8);
  std::operator<<((ostream *)this_00," #");
  std::ostream::operator<<(this_00,targetHandle);
  std::operator<<((ostream *)this_00,".\n");
  std::operator<<((ostream *)this_00,"\tWriting results to result storage #");
  *resultStorageFriendlyName = *resultStorageFriendlyName + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,resultStorageFriendlyName);
  std::operator<<((ostream *)&pMVar5->m_str,".\n");
  std::operator<<((ostream *)&pMVar5->m_str,"\tDispatch size: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  std::operator<<((ostream *)&pMVar5->m_str,"x");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  std::operator<<((ostream *)&pMVar5->m_str,".");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  lVar9 = (long)local_1b4;
  (**(code **)(lVar4 + 0x1680))
            (((this->m_operationPrograms).
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9]->m_program).m_program);
  if (this->m_storage == STORAGE_IMAGE) {
    pcVar1 = *(code **)(lVar4 + 0x80);
    pmVar6 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&targetHandle_local);
    uVar7 = 0x822e;
    if (this->m_formatInteger != false) {
      uVar7 = 0x8235;
    }
    (*pcVar1)(1,*pmVar6,0,0,0,(uint)this->m_useAtomic * 2 + 35000,uVar7);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar8 = "bind source image";
    iVar2 = 0x65a;
  }
  else {
    if (this->m_storage != STORAGE_BUFFER) goto LAB_00493a81;
    pcVar1 = *(code **)(lVar4 + 0x48);
    pmVar6 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&targetHandle_local);
    (*pcVar1)(0x90d2,1,*pmVar6);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar8 = "bind source buffer";
    iVar2 = 0x653;
  }
  glu::checkError(dVar3,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,iVar2);
LAB_00493a81:
  (**(code **)(lVar4 + 0x48))
            (0x90d2,0,(this->m_operationResultStorages).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9]);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"bind result buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x662);
  (**(code **)(lVar4 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"dispatch read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x666);
  return;
}

Assistant:

void InterCallTestCase::runSingleRead (int targetHandle, int stepNdx, int& programFriendlyName, int& resultStorageFriendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Running program #" << ++programFriendlyName << " to verify " << ((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) << " #" << targetHandle << ".\n"
		<< "	Writing results to result storage #" << ++resultStorageFriendlyName << ".\n"
		<< "	Dispatch size: " << m_invocationGridSize << "x" << m_invocationGridSize << "."
		<< tcu::TestLog::EndMessage;

	gl.useProgram(m_operationPrograms[stepNdx]->getProgram());

	// set source
	if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(m_storageIDs[targetHandle]);

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storageIDs[targetHandle]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source buffer");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(m_storageIDs[targetHandle]);

		gl.bindImageTexture(1, m_storageIDs[targetHandle], 0, GL_FALSE, 0, (m_useAtomic) ? (GL_READ_WRITE) : (GL_READ_ONLY), (m_formatInteger) ? (GL_R32I) : (GL_R32F));
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source image");
	}
	else
		DE_ASSERT(DE_FALSE);

	// set destination
	DE_ASSERT(m_operationResultStorages[stepNdx]);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_operationResultStorages[stepNdx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buffer");

	// calc
	gl.dispatchCompute(m_invocationGridSize, m_invocationGridSize, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch read");
}